

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::internal::UnitTestOptions::FilterMatchesTest
               (string *test_suite_name,string *test_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  char *pcVar6;
  size_t sVar7;
  ulong extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  char *pcVar9;
  size_type __len1;
  size_type __len2;
  _Alloc_hider _Var10;
  string positive;
  string negative;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar1 = &local_b0.field_2;
  pcVar2 = (test_suite_name->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar2,pcVar2 + test_suite_name->_M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_b0,".");
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_b0,(test_name->_M_dataplus)._M_p);
  local_90._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == paVar8) {
    local_90.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_90._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  pcVar9 = FLAGS_gtest_filter_abi_cxx11_;
  pcVar6 = strchr(FLAGS_gtest_filter_abi_cxx11_,0x2d);
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  paVar8 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar8;
  if (pcVar6 == (char *)0x0) {
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    sVar7 = strlen(pcVar9);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_b0,0,0,pcVar9,sVar7);
    pcVar9 = "";
    pbVar5 = &local_50;
    __len2 = 0;
    __len1 = local_50._M_string_length;
  }
  else {
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,pcVar9,pcVar6);
    pbVar5 = &local_b0;
    FilterMatchesTest();
    local_70[0] = local_60;
    sVar7 = strlen(pcVar6 + 1);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,pcVar6 + 1,pcVar6 + sVar7 + 1);
    FilterMatchesTest();
    if ((extraout_RAX & 1) == 0) goto LAB_001364e9;
    __len2 = 1;
    pcVar9 = "*";
    __len1 = 0;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (pbVar5,0,__len1,pcVar9,__len2);
LAB_001364e9:
  _Var10._M_p = local_b0._M_dataplus._M_p;
  bVar4 = MatchesFilter(&local_90,local_b0._M_dataplus._M_p);
  _Var3._M_p = local_50._M_dataplus._M_p;
  if (bVar4) {
    bVar4 = MatchesFilter(&local_90,local_50._M_dataplus._M_p);
    bVar4 = !bVar4;
  }
  else {
    bVar4 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar8) {
    operator_delete(_Var3._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
    _Var10._M_p = local_b0._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var10._M_p != paVar1) {
    operator_delete(_Var10._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool UnitTestOptions::FilterMatchesTest(const std::string& test_suite_name,
                                        const std::string& test_name) {
  const std::string& full_name = test_suite_name + "." + test_name.c_str();

  // Split --gtest_filter at '-', if there is one, to separate into
  // positive filter and negative filter portions
  const char* const p = GTEST_FLAG(filter).c_str();
  const char* const dash = strchr(p, '-');
  std::string positive;
  std::string negative;
  if (dash == nullptr) {
    positive = GTEST_FLAG(filter).c_str();  // Whole string is a positive filter
    negative = "";
  } else {
    positive = std::string(p, dash);   // Everything up to the dash
    negative = std::string(dash + 1);  // Everything after the dash
    if (positive.empty()) {
      // Treat '-test1' as the same as '*-test1'
      positive = kUniversalFilter;
    }
  }

  // A filter is a colon-separated list of patterns.  It matches a
  // test if any pattern in it matches the test.
  return (MatchesFilter(full_name, positive.c_str()) &&
          !MatchesFilter(full_name, negative.c_str()));
}